

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

bool __thiscall
GlobOpt::PreparePropertySymOpndForTypeCheckSeq
          (GlobOpt *this,PropertySymOpnd *propertySymOpnd,Instr *instr,Loop *loop)

{
  bool bVar1;
  ObjTypeSpecFldInfo *this_00;
  EquivalentTypeSet *pEVar2;
  PropertySym *propertySym_00;
  PropertySymOpnd *pPVar3;
  PropertySym *propertySym;
  ObjTypeSpecFldInfo *info;
  Loop *loop_local;
  Instr *instr_local;
  PropertySymOpnd *propertySymOpnd_local;
  GlobOpt *this_local;
  
  bVar1 = DoFieldRefOpts(this,loop);
  if (((!bVar1) || (bVar1 = OpCodeAttr::FastFldInstr(instr->m_opcode), !bVar1)) ||
     (bVar1 = IR::Instr::CallsAccessor(instr,(PropertySymOpnd *)0x0), bVar1)) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = IR::PropertySymOpnd::HasObjTypeSpecFldInfo(propertySymOpnd);
    if (bVar1) {
      this_00 = IR::PropertySymOpnd::GetObjTypeSpecInfo(propertySymOpnd);
      bVar1 = ObjTypeSpecFldInfo::UsesAccessor(this_00);
      if ((bVar1) ||
         (bVar1 = ObjTypeSpecFldInfo::IsRootObjectNonConfigurableFieldLoad(this_00), bVar1)) {
        this_local._7_1_ = false;
      }
      else {
        bVar1 = ObjTypeSpecFldInfo::IsPoly(this_00);
        if ((bVar1) &&
           (pEVar2 = ObjTypeSpecFldInfo::GetEquivalentTypeSet(this_00),
           pEVar2 == (EquivalentTypeSet *)0x0)) {
          this_local._7_1_ = false;
        }
        else {
          propertySym_00 = Sym::AsPropertySym((propertySymOpnd->super_SymOpnd).m_sym);
          PreparePropertySymForTypeCheckSeq(this,propertySym_00);
          IR::PropertySymOpnd::SetTypeCheckSeqCandidate(propertySymOpnd,true);
          pPVar3 = (PropertySymOpnd *)IR::Instr::GetDst(instr);
          IR::PropertySymOpnd::SetIsBeingStored(propertySymOpnd,propertySymOpnd == pPVar3);
          this_local._7_1_ = true;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
GlobOpt::PreparePropertySymOpndForTypeCheckSeq(IR::PropertySymOpnd * propertySymOpnd, IR::Instr* instr, Loop * loop)
{
    if (!DoFieldRefOpts(loop) || !OpCodeAttr::FastFldInstr(instr->m_opcode) || instr->CallsAccessor())
    {
        return false;
    }

    if (!propertySymOpnd->HasObjTypeSpecFldInfo())
    {
        return false;
    }

    ObjTypeSpecFldInfo* info = propertySymOpnd->GetObjTypeSpecInfo();

    if (info->UsesAccessor() || info->IsRootObjectNonConfigurableFieldLoad())
    {
        return false;
    }

    if (info->IsPoly() && !info->GetEquivalentTypeSet())
    {
        return false;
    }

    PropertySym * propertySym = propertySymOpnd->m_sym->AsPropertySym();

    PreparePropertySymForTypeCheckSeq(propertySym);
    propertySymOpnd->SetTypeCheckSeqCandidate(true);
    propertySymOpnd->SetIsBeingStored(propertySymOpnd == instr->GetDst());

    return true;
}